

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomReporter.cpp
# Opt level: O2

shared_ptr<ApprovalTests::GenericDiffReporter> __thiscall
ApprovalTests::CustomReporter::createForegroundReporter
          (CustomReporter *this,string *path,string *arguments,Type type,bool allowNonZeroExitCodes)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<ApprovalTests::GenericDiffReporter> sVar1;
  string sStack_b8;
  string local_98;
  DiffInfo info;
  
  ::std::__cxx11::string::string((string *)&local_98,(string *)path);
  ::std::__cxx11::string::string((string *)&sStack_b8,(string *)arguments);
  DiffInfo::DiffInfo(&info,&local_98,&sStack_b8,type);
  ::std::__cxx11::string::~string((string *)&sStack_b8);
  ::std::__cxx11::string::~string((string *)&local_98);
  ::std::make_shared<ApprovalTests::GenericDiffReporter,ApprovalTests::DiffInfo&>((DiffInfo *)this);
  SystemLauncher::setForeground((SystemLauncher *)(*(long *)this + 0x60),true);
  SystemLauncher::setAllowNonZeroExitCodes
            ((SystemLauncher *)(*(long *)this + 0x60),allowNonZeroExitCodes);
  DiffInfo::~DiffInfo(&info);
  sVar1.super___shared_ptr<ApprovalTests::GenericDiffReporter,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<ApprovalTests::GenericDiffReporter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<ApprovalTests::GenericDiffReporter>)
         sVar1.super___shared_ptr<ApprovalTests::GenericDiffReporter,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<GenericDiffReporter> CustomReporter::createForegroundReporter(
        std::string path, std::string arguments, Type type, bool allowNonZeroExitCodes)
    {
        DiffInfo info(std::move(path), std::move(arguments), type);
        auto reporter = std::make_shared<GenericDiffReporter>(info);
        reporter->launcher.setForeground(true);
        reporter->launcher.setAllowNonZeroExitCodes(allowNonZeroExitCodes);
        return reporter;
    }